

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O2

char * Ses_ManFindMinimumSize(Ses_Man_t *pSes)

{
  int *piVar1;
  word *pwVar2;
  Vec_Int_t *p;
  byte bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int avail;
  int iVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  bool bVar18;
  word pMask [4];
  word local_58 [5];
  
  iVar5 = pSes->nSpecFunc;
  if (1 < iVar5) {
    uVar12 = pSes->nStartGates;
    do {
      uVar12 = uVar12 + 1;
      if (pSes->fVerbose != 0) {
        printf("try with %d gates\n",(ulong)uVar12);
      }
      *(undefined4 *)(pSes->pTtValues + 2) = 0xffffffff;
      *(undefined4 *)((long)pSes->pTtValues + 0x14) = 0xffffffff;
      *(undefined4 *)(pSes->pTtValues + 3) = 0xffffffff;
      *(undefined4 *)((long)pSes->pTtValues + 0x1c) = 0xffffffff;
      *(undefined4 *)pSes->pTtValues = 0xffffffff;
      *(undefined4 *)((long)pSes->pTtValues + 4) = 0xffffffff;
      *(undefined4 *)(pSes->pTtValues + 1) = 0xffffffff;
      *(undefined4 *)((long)pSes->pTtValues + 0xc) = 0xffffffff;
      iVar5 = Ses_ManFindNetworkExact(pSes,uVar12);
    } while (iVar5 == 2);
    if (iVar5 == 0) {
      return (char *)0x0;
    }
    pcVar7 = Ses_ManExtractSolution(pSes);
    return pcVar7;
  }
  uVar12 = pSes->nMaxDepth;
  uVar9 = (ulong)uVar12;
  if ((uVar12 == 0xffffffff) || (piVar1 = pSes->pArrTimeProfile, piVar1 == (int *)0x0))
  goto LAB_0027faa0;
  pSes->vStairDecVars->nSize = 0;
  pSes->fDecStructure = 0;
  uVar6 = pSes->nSpecVars;
  uVar11 = (ulong)uVar6;
  iVar13 = 0;
  uVar14 = 0;
  if (0 < (int)uVar6) {
    uVar14 = (ulong)uVar6;
  }
  for (uVar10 = 0; uVar14 != uVar10; uVar10 = uVar10 + 1) {
    uVar16 = piVar1[uVar10];
    uVar8 = (ulong)uVar16;
    if ((int)uVar12 <= (int)uVar16) {
      if (pSes->fReasonVerbose == 0) {
        return (char *)0x0;
      }
      pcVar7 = "give up due to impossible arrival time (depth = %d, input = %d, arrival time = %d)";
      goto LAB_0027f8bd;
    }
    if ((iVar5 == 1) && (uVar16 + 1 == uVar12)) {
      if ((iVar13 == 2) || (2 < (int)uVar6 && iVar13 == 1)) {
        if (pSes->fReasonVerbose == 0) {
          return (char *)0x0;
        }
        pcVar7 = 
        "give up due to impossible decomposition (depth = %d, input = %d, arrival time = %d)";
        goto LAB_0027f8bd;
      }
      iVar13 = iVar13 + 1;
      pSes->fDecStructure = iVar13;
      if (((uint)pSes->pDecVars >> ((uint)uVar10 & 0x1f) & 1) == 0) {
        if (pSes->fReasonVerbose == 0) {
          return (char *)0x0;
        }
        uVar8 = (ulong)(uint)piVar1[uVar10];
        pcVar7 = 
        "give up due to impossible decomposition (depth = %d, input = %d, arrival time = %d)";
        goto LAB_0027f8bd;
      }
    }
  }
  if (iVar13 == 0) {
LAB_0027f9ab:
    iVar5 = ((int)uVar11 == 4) + 3;
    bVar3 = 0;
  }
  else {
    iVar5 = 1;
    do {
      iVar13 = iVar5;
      iVar15 = 0;
      for (lVar17 = 0; lVar17 < (int)uVar11; lVar17 = lVar17 + 1) {
        if (pSes->pArrTimeProfile[lVar17] + iVar13 == pSes->nMaxDepth) {
          if (iVar15 == 0) {
            Vec_IntPush(pSes->vStairDecVars,(int)lVar17);
            uVar11 = (ulong)(uint)pSes->nSpecVars;
          }
          else {
            if (iVar13 != pSes->vStairDecVars->nSize) {
              __assert_fail("nLevel == Vec_IntSize( pSes->vStairDecVars )",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                            ,0x806,"int Ses_CheckDepthConsistency(Ses_Man_t *)");
            }
            if ((1 < iVar15) || (iVar13 + 1 < (int)uVar11)) {
              if (pSes->fReasonVerbose == 0) {
                return (char *)0x0;
              }
              printf("give up due to impossible decomposition at level %d",iVar13);
              return (char *)0x0;
            }
          }
          iVar15 = iVar15 + 1;
        }
      }
      iVar5 = iVar13 + 1;
    } while (iVar15 != 0);
    iVar5 = pSes->vStairDecVars->nSize;
    if (iVar5 != 0) {
      pwVar2 = pSes->pSpec;
      uVar12 = pSes->nSpecWords;
      piVar1 = pSes->vStairDecVars->pArray;
      uVar9 = 0;
      uVar11 = 0;
      if (0 < (int)uVar12) {
        uVar11 = (ulong)uVar12;
      }
      for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
        local_58[uVar9] = pwVar2[uVar9];
      }
      Abc_TtMask(pMask,uVar12,uVar12 << 6);
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      if (iVar5 != 0) {
        iVar5 = Abc_TtIsTopDecomposable(local_58,pMask,uVar12,*piVar1);
        if (iVar5 != 0) {
          pSes->pStairDecFunc[0] = iVar5;
          pcVar7 = (char *)(*(code *)(&DAT_007a0ab0 +
                                     *(int *)(&DAT_007a0ab0 + (ulong)(iVar5 - 1) * 4)))();
          return pcVar7;
        }
        if (pSes->fReasonVerbose != 0) {
          printf("give up due to impossible stair decomposition at level %d: ",iVar13);
          p = pSes->vStairDecVars;
          printf("Vector has %d entries: {",(ulong)(uint)p->nSize);
          for (iVar5 = 0; iVar5 < p->nSize; iVar5 = iVar5 + 1) {
            uVar12 = Vec_IntEntry(p,iVar5);
            printf(" %d",(ulong)uVar12);
          }
          puts(" }");
          return (char *)0x0;
        }
        return (char *)0x0;
      }
      uVar11 = (ulong)(uint)pSes->nSpecVars;
    }
    if (pSes->fDecStructure == 0) goto LAB_0027f9ab;
    iVar5 = ((int)uVar11 == 3) + 1;
    bVar3 = 1;
  }
  uVar10 = 0;
  iVar13 = (int)uVar11;
  uVar14 = 0;
  if (0 < iVar13) {
    uVar14 = uVar11;
  }
  uVar12 = pSes->nMaxDepth;
  uVar9 = (ulong)uVar12;
  iVar15 = 0;
  for (; uVar14 != uVar10; uVar10 = uVar10 + 1) {
    uVar8 = (ulong)(uint)pSes->pArrTimeProfile[uVar10];
    uVar6 = pSes->pArrTimeProfile[uVar10] + 2;
    if (uVar6 == uVar12) {
      if (iVar5 <= iVar15) {
        if (pSes->fReasonVerbose == 0) {
          return (char *)0x0;
        }
        pcVar7 = 
        "give up due to impossible decomposition at second level (depth = %d, input = %d, arrival time = %d)"
        ;
        uVar9 = (ulong)uVar6;
        goto LAB_0027f8bd;
      }
      iVar15 = iVar15 + 1;
    }
  }
  if ((bool)(4 < iVar13 & bVar3 & iVar15 == 1)) {
    bVar18 = false;
    for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
      uVar8 = (ulong)(uint)pSes->pArrTimeProfile[uVar10];
      bVar4 = bVar18;
      if ((pSes->pArrTimeProfile[uVar10] + 3U == uVar12) && (bVar4 = true, bVar18)) {
        if (pSes->fReasonVerbose == 0) {
          return (char *)0x0;
        }
        pcVar7 = 
        "give up due to impossible decomposition at third level (depth = %d, input = %d, arrival time = %d)"
        ;
LAB_0027f8bd:
        printf(pcVar7,uVar9,uVar10,uVar8);
        return (char *)0x0;
      }
      bVar18 = bVar4;
    }
  }
  pSes->nMaxGates = 0;
  iVar5 = 0;
  uVar14 = 0;
  if (0 < iVar13) {
    uVar14 = uVar11;
  }
  iVar13 = 1;
  while( true ) {
    bVar18 = uVar12 == 0;
    uVar12 = uVar12 - 1;
    if (((iVar13 == 0) || (bVar18)) || ((int)uVar11 * 2 <= iVar13)) break;
    for (uVar10 = 0; uVar14 != uVar10; uVar10 = uVar10 + 1) {
      uVar6 = (uint)(pSes->pArrTimeProfile[uVar10] == (int)uVar9);
      iVar13 = iVar13 - uVar6;
      uVar11 = (ulong)((int)uVar11 - uVar6);
    }
    iVar5 = iVar5 + iVar13;
    pSes->nMaxGates = iVar5;
    iVar13 = iVar13 * 2;
    uVar9 = (ulong)uVar12;
  }
LAB_0027faa0:
  uVar12 = pSes->nStartGates;
  pMask[0] = 0;
  pSes->fHitResLimit = 0;
  iVar5 = pSes->fVeryVerbose;
  iVar13 = pSes->nMaxGates;
  pSes->nDebugOffset = 9 < iVar13 | 2;
  iVar15 = pSes->vStairDecVars->nSize;
  uVar6 = iVar15 - 1U;
  if ((int)(iVar15 - 1U) < (int)uVar12) {
    uVar6 = uVar12;
  }
  if (iVar15 == 0) {
    uVar6 = uVar12;
  }
  pcVar7 = (char *)(ulong)uVar6;
  pSes->pTtValues[2] = 0;
  pSes->pTtValues[3] = 0;
  pSes->pTtValues[0] = 0;
  pSes->pTtValues[1] = 0;
  Abc_DebugPrintIntInt(pcVar7,iVar13,iVar5,iVar15);
  do {
    iVar5 = (int)pcVar7;
    pcVar7 = (char *)(ulong)(iVar5 + 1U);
    uVar12 = Ses_ManFindNetworkExactCEGAR(pSes,iVar5 + 1U,(char **)pMask);
    if (uVar12 == 0) {
      pSes->fHitResLimit = 1;
      break;
    }
  } while ((uVar12 & 1) == 0);
  uVar12 = (uint)(8 < iVar5);
  Abc_DebugErase(pSes->nDebugOffset + (uint)(8 < iVar5) + 4,pSes->fVeryVerbose);
  if (pMask[0] != 0) {
    return (char *)pMask[0];
  }
  if ((pSes->nMaxDepth != -1) && (pSes->fHitResLimit != 0)) {
    uVar6 = pSes->nMaxGates;
    if (pSes->nGates != uVar6) {
      uVar16 = pSes->nGates + 1;
      pMask[0] = 0;
      pSes->fHitResLimit = 0;
      Abc_DebugPrintIntInt((char *)(ulong)uVar6,uVar6,pSes->fVeryVerbose,uVar12);
      pcVar7 = (char *)0x0;
      while (iVar5 = Ses_ManFindNetworkExactCEGAR(pSes,uVar6,(char **)pMask), iVar5 == 1) {
        pcVar7 = (char *)pMask[0];
        if (uVar16 == uVar6) goto LAB_0027fc01;
        uVar6 = uVar6 - 1;
      }
      uVar16 = uVar6;
      if (iVar5 == 0) {
        pSes->fHitResLimit = 1;
      }
LAB_0027fc01:
      Abc_DebugErase(pSes->nDebugOffset + (uint)(9 < (int)uVar16) + 4,pSes->fVeryVerbose);
      return pcVar7;
    }
  }
  return (char *)0x0;
}

Assistant:

static char * Ses_ManFindMinimumSize( Ses_Man_t * pSes )
{
    char * pSol = NULL;
    int i = pSes->nStartGates + 1, fRes;

    /* if more than one function, no CEGAR */
    if ( pSes->nSpecFunc > 1 )
    {
      while ( true )
      {
        if ( pSes->fVerbose )
        {
          printf( "try with %d gates\n", i );
        }

        memset( pSes->pTtValues, ~0, 4 * sizeof( word ) );
        fRes = Ses_ManFindNetworkExact( pSes, i++ );
        if ( fRes == 2 ) continue;
        if ( fRes == 0 ) break;

        pSol = Ses_ManExtractSolution( pSes );
        break;
      }

      return pSol;
    }

    /* do the arrival times allow for a network? */
    if ( pSes->nMaxDepth != -1 && pSes->pArrTimeProfile )
    {
        if ( !Ses_CheckDepthConsistency( pSes ) )
            return 0;
        Ses_ManComputeMaxGates( pSes );
    }

    pSol = Ses_ManFindMinimumSizeBottomUp( pSes );

    if ( !pSol && pSes->nMaxDepth != -1 && pSes->fHitResLimit && pSes->nGates != pSes->nMaxGates )
        return Ses_ManFindMinimumSizeTopDown( pSes, pSes->nGates + 1 );
    else
        return pSol;
}